

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ArrayJoinPromiseNode<int>::ArrayJoinPromiseNode
          (ArrayJoinPromiseNode<int> *this,Array<kj::Own<kj::_::PromiseNode>_> *promises,
          Array<kj::_::ExceptionOr<int>_> *resultParts)

{
  Own<kj::_::PromiseNode> *pOVar1;
  size_t sVar2;
  Array<kj::Own<kj::_::PromiseNode>_> local_28;
  
  local_28.ptr = promises->ptr;
  local_28.size_ = promises->size_;
  local_28.disposer = promises->disposer;
  promises->ptr = (Own<kj::_::PromiseNode> *)0x0;
  promises->size_ = 0;
  ArrayJoinPromiseNodeBase::ArrayJoinPromiseNodeBase
            (&this->super_ArrayJoinPromiseNodeBase,&local_28,
             &resultParts->ptr->super_ExceptionOrValue,0x168);
  sVar2 = local_28.size_;
  pOVar1 = local_28.ptr;
  if (local_28.ptr != (Own<kj::_::PromiseNode> *)0x0) {
    local_28.ptr = (Own<kj::_::PromiseNode> *)0x0;
    local_28.size_ = 0;
    (**(local_28.disposer)->_vptr_ArrayDisposer)
              (local_28.disposer,pOVar1,0x10,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Own<kj::_::PromiseNode>,_false>::destruct);
  }
  (this->super_ArrayJoinPromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_00454328;
  (this->resultParts).ptr = resultParts->ptr;
  (this->resultParts).size_ = resultParts->size_;
  (this->resultParts).disposer = resultParts->disposer;
  resultParts->ptr = (ExceptionOr<int> *)0x0;
  resultParts->size_ = 0;
  return;
}

Assistant:

ArrayJoinPromiseNode(Array<Own<PromiseNode>> promises,
                       Array<ExceptionOr<T>> resultParts)
      : ArrayJoinPromiseNodeBase(kj::mv(promises), resultParts.begin(), sizeof(ExceptionOr<T>)),
        resultParts(kj::mv(resultParts)) {}